

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agent.cpp
# Opt level: O3

void __thiscall
so_5::state_t::time_limit_t::time_limit_t
          (time_limit_t *this,duration_t limit,state_t *state_to_switch)

{
  (this->m_limit).__r = limit.__r;
  this->m_state_to_switch = state_to_switch;
  (this->m_unique_mbox).m_obj = (abstract_message_box_t *)0x0;
  timer_id_t::timer_id_t(&this->m_timer);
  return;
}

Assistant:

time_limit_t(
		duration_t limit,
		const state_t & state_to_switch )
		:	m_limit( limit )
		,	m_state_to_switch( state_to_switch )
	{}